

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

void hashtest(uint32_t version,uint32_t t,uint32_t m,uint32_t p,char *pwd,char *salt,char *hexref,
             char *mcfref)

{
  byte bVar1;
  uint __line;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  char *__assertion;
  uchar *__s;
  ulong uVar5;
  uchar out [32];
  uchar hex_out [68];
  char encoded [108];
  
  printf("Hash test: $v=%d t=%d, m=%d, p=%d, pass=%s, salt=%s: ",(ulong)version,(ulong)t,(ulong)m,
         (ulong)p,pwd,salt);
  bVar1 = (byte)m & 0x1f;
  sVar3 = strlen(pwd);
  sVar4 = strlen(salt);
  iVar2 = argon2_hash(t,1 << bVar1,p,pwd,sVar3,salt,sVar4,out,0x20,encoded,0x6c,1,(ulong)version);
  if (iVar2 == 0) {
    __s = hex_out;
    for (uVar5 = (ulong)(uint)(0 << bVar1); uVar5 != 0x20; uVar5 = uVar5 + 1) {
      sprintf((char *)__s,"%02x",(ulong)out[uVar5]);
      __s = __s + 2;
    }
    iVar2 = bcmp(hex_out,hexref,0x40);
    if (iVar2 == 0) {
      if (version == 0x13) {
        sVar3 = strlen(mcfref);
        iVar2 = bcmp(encoded,mcfref,sVar3);
        if (iVar2 != 0) {
          __assertion = "memcmp(encoded, mcfref, strlen(mcfref)) == 0";
          __line = 0x29;
          goto LAB_001013f1;
        }
      }
      sVar3 = strlen(pwd);
      iVar2 = argon2_verify(encoded,pwd,sVar3,1);
      if (iVar2 == 0) {
        sVar3 = strlen(pwd);
        iVar2 = argon2_verify(mcfref,pwd,sVar3,1);
        if (iVar2 == 0) {
          puts("PASS");
          return;
        }
        __assertion = "ret == ARGON2_OK";
        __line = 0x2f;
      }
      else {
        __assertion = "ret == ARGON2_OK";
        __line = 0x2d;
      }
    }
    else {
      __assertion = "memcmp(hex_out, hexref, OUT_LEN * 2) == 0";
      __line = 0x26;
    }
  }
  else {
    __assertion = "ret == ARGON2_OK";
    __line = 0x21;
  }
LAB_001013f1:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WOnder93[P]argon2/tests/test.c",
                __line,
                "void hashtest(uint32_t, uint32_t, uint32_t, uint32_t, char *, char *, char *, char *)"
               );
}

Assistant:

void hashtest(uint32_t version, uint32_t t, uint32_t m, uint32_t p, char *pwd,
              char *salt, char *hexref, char *mcfref) {
    unsigned char out[OUT_LEN];
    unsigned char hex_out[OUT_LEN * 2 + 4];
    char encoded[ENCODED_LEN];
    int ret, i;

    printf("Hash test: $v=%d t=%d, m=%d, p=%d, pass=%s, salt=%s: ", version,
           t, m, p, pwd, salt);

    ret = argon2_hash(t, 1 << m, p, pwd, strlen(pwd), salt, strlen(salt), out,
                      OUT_LEN, encoded, ENCODED_LEN, Argon2_i, version);
    assert(ret == ARGON2_OK);

    for (i = 0; i < OUT_LEN; ++i)
        sprintf((char *)(hex_out + i * 2), "%02x", out[i]);

    assert(memcmp(hex_out, hexref, OUT_LEN * 2) == 0);

    if (ARGON2_VERSION_NUMBER == version) {
        assert(memcmp(encoded, mcfref, strlen(mcfref)) == 0);
    }

    ret = argon2_verify(encoded, pwd, strlen(pwd), Argon2_i);
    assert(ret == ARGON2_OK);
    ret = argon2_verify(mcfref, pwd, strlen(pwd), Argon2_i);
    assert(ret == ARGON2_OK);

    printf("PASS\n");
}